

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>::
char_spec_handler::on_int(char_spec_handler *this)

{
  size_t in_RCX;
  void *in_RDX;
  long *in_RDI;
  char in_stack_0000001f;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *in_stack_00000020;
  
  if (*(long *)(*in_RDI + 0x10) == 0) {
    basic_writer<duckdb_fmt::v6::buffer_range<char>_>::write
              ((basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)*in_RDI,(int)(char)in_RDI[1],
               in_RDX,in_RCX);
  }
  else {
    basic_writer<duckdb_fmt::v6::buffer_range<char>>::
    write_int<char,duckdb_fmt::v6::basic_format_specs<char>>
              (in_stack_00000020,in_stack_0000001f,(basic_format_specs<char> *)this);
  }
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.writer_.write_int(value, *formatter.specs_);
      else
        formatter.writer_.write(value);
    }